

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O3

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefToken *token_,
          int lower,int upper_,bool matchNot,string *fileName_)

{
  TokenRef *pTVar1;
  int line_;
  int column_;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Mismatched Token","");
  line_ = (*token_->ref->ptr->_vptr_Token[3])();
  column_ = (*token_->ref->ptr->_vptr_Token[2])();
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,fileName_,line_,column_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_00301638;
  pTVar1 = token_->ref;
  if (pTVar1 != (TokenRef *)0x0) {
    pTVar1->count = pTVar1->count + 1;
  }
  (this->token).ref = pTVar1;
  (this->node).ref = (ASTRef *)0x0;
  (*token_->ref->ptr->_vptr_Token[4])(&this->tokenText);
  this->mismatchType = matchNot + 3;
  this->expecting = lower;
  this->upper = upper_;
  BitSet::BitSet(&this->set,0x40);
  this->tokenNames = tokenNames_;
  this->numTokens = numTokens_;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("Mismatched Token",fileName_,token_->getLine(),token_->getColumn())
  , token(token_)
  , node(nullASTptr)
  , tokenText(token_->getText())
  , mismatchType(matchNot ? NOT_RANGE : RANGE)
  , expecting(lower)
  , upper(upper_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}